

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O2

void Io_BlifSplitIntoTokens(Vec_Ptr_t *vTokens,char *pLine,char Stop)

{
  byte bVar1;
  byte *pOutput;
  char *pCur;
  
  for (pOutput = (byte *)pLine; bVar1 = *pOutput, bVar1 != Stop; pOutput = pOutput + 1) {
    if ((bVar1 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) {
      *pOutput = 0;
    }
  }
  Io_BlifCollectTokens(vTokens,pLine,(char *)pOutput);
  return;
}

Assistant:

static void Io_BlifSplitIntoTokens( Vec_Ptr_t * vTokens, char * pLine, char Stop )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != Stop; pCur++ )
        if ( Io_BlifCharIsSpace(*pCur) )
            *pCur = 0;
    // collect tokens
    Io_BlifCollectTokens( vTokens, pLine, pCur );
}